

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuWorker.cpp
# Opt level: O0

void __thiscall xmrig::CpuWorker<4UL>::CpuWorker(CpuWorker<4UL> *this,size_t id,CpuLaunchData *data)

{
  AlgoVariant AVar1;
  void *pvVar2;
  CpuLaunchData *in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  VirtualMemory *unaff_retaddr;
  undefined8 *local_40;
  int64_t in_stack_ffffffffffffffd0;
  AlgoVariant *pAVar3;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  WorkerJob<4UL> *in_stack_ffffffffffffffe0;
  undefined8 *size;
  
  size = in_RDI;
  Worker::Worker((Worker *)in_stack_ffffffffffffffe0,
                 CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                 in_stack_ffffffffffffffd0,(int)((ulong)in_RDI >> 0x20));
  *in_RDI = &PTR__CpuWorker_002b7f60;
  *(Id *)(in_RDI + 7) = (in_RDX->assembly).m_id;
  *(byte *)((long)in_RDI + 0x3c) = in_RDX->hwAES & 1;
  pAVar3 = (AlgoVariant *)(in_RDI + 8);
  AVar1 = CpuLaunchData::av(in_RDX);
  *pAVar3 = AVar1;
  in_RDI[9] = in_RDX->miner;
  memset(in_RDI + 10,0,0x20);
  *(undefined1 *)(in_RDI + 0xe) = 0;
  local_40 = (undefined8 *)((long)in_RDI + 0x71);
  do {
    *(undefined1 *)local_40 = 0;
    local_40 = (undefined8 *)((long)local_40 + 1);
  } while (local_40 != in_RDI + 0x1e);
  in_RDI[0x1e] = 0;
  WorkerJob<4UL>::WorkerJob(in_stack_ffffffffffffffe0);
  pvVar2 = operator_new(0x20);
  VirtualMemory::VirtualMemory
            (unaff_retaddr,(size_t)size,SUB81((ulong)in_RSI >> 0x38,0),
             SUB81((ulong)in_RSI >> 0x30,0),(uint32_t)in_RSI,(size_t)in_RDX);
  in_RDI[0x1e] = pvVar2;
  return;
}

Assistant:

xmrig::CpuWorker<N>::CpuWorker(size_t id, const CpuLaunchData &data) :
    Worker(id, data.affinity, data.priority),
    m_assembly(data.assembly),
    m_hwAES(data.hwAES),
    m_av(data.av()),
    m_miner(data.miner),
    m_ctx()
{
    m_memory = new VirtualMemory(CnAlgo::CN_MEMORY * N, data.hugePages, true, m_node);
}